

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteCollectionDropRecord(unqlite_col *pCol,jx9_int64 nId,int wr_header,int log_err)

{
  int iVar1;
  long iTotal;
  
  SyBlobReset(&pCol->sWorker);
  SyBlobFormat(&pCol->sWorker,"%z_%qd",&pCol->sName,nId);
  unqlite_kv_cursor_reset(pCol->pCursor);
  iVar1 = unqlite_kv_cursor_seek(pCol->pCursor,(pCol->sWorker).pBlob,(pCol->sWorker).nByte,1);
  if (iVar1 == 0) {
    iVar1 = unqlite_kv_cursor_delete_entry(pCol->pCursor);
    unqliteCollectionCacheRemoveRecord(pCol,nId);
    if (iVar1 == 0) {
      iTotal = pCol->nTotRec + -1;
      pCol->nTotRec = iTotal;
      if (wr_header != 0) {
        iVar1 = CollectionSetHeader((unqlite_kv_engine *)0x0,pCol,-1,iTotal,(jx9_value *)0x0);
        return iVar1;
      }
      iVar1 = 0;
    }
    else if (log_err != 0 && iVar1 == -0x11) {
      unqliteGenErrorFormat
                (pCol->pVm->pDb,
                 "Cannot delete record from collection \'%z\' due to a read-only Key/Value storage engine"
                 ,&pCol->sName);
      iVar1 = -0x11;
    }
  }
  return iVar1;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionDropRecord(
	unqlite_col *pCol,  /* Target collection */
	jx9_int64 nId,      /* Unique ID of the record to be droped */
	int wr_header,      /* True to alter collection header */
	int log_err         /* True to log error */
	)
{
	SyBlob *pWorker = &pCol->sWorker;
	int rc;		
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	/* Prepare the unique ID for this record */
	SyBlobFormat(pWorker,"%z_%qd",&pCol->sName,nId);
	/* Reset the cursor */
	unqlite_kv_cursor_reset(pCol->pCursor);
	/* Seek the cursor to the desired location */
	rc = unqlite_kv_cursor_seek(pCol->pCursor,
		SyBlobData(pWorker),SyBlobLength(pWorker),
		UNQLITE_CURSOR_MATCH_EXACT
		);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Remove the record from the storage engine */
	rc = unqlite_kv_cursor_delete_entry(pCol->pCursor);
	/* Finally, Remove the record from the cache */
	unqliteCollectionCacheRemoveRecord(pCol,nId);
	if( rc == UNQLITE_OK ){
		pCol->nTotRec--;
		if( wr_header ){
			/* Relect in the collection header */
			rc = CollectionSetHeader(0,pCol,-1,pCol->nTotRec,0);
		}
	}else if( rc == UNQLITE_NOTIMPLEMENTED ){
		if( log_err ){
			unqliteGenErrorFormat(pCol->pVm->pDb,
				"Cannot delete record from collection '%z' due to a read-only Key/Value storage engine",
				&pCol->sName
				);
		}
	}
	return rc;
}